

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

_Bool react_to_specific_slay(slay_conflict *slay,monster *mon)

{
  _Bool _Var1;
  int iVar2;
  monster *mon_local;
  slay_conflict *slay_local;
  
  if (slay->name == (char *)0x0) {
    slay_local._7_1_ = false;
  }
  else if (mon->race->base == (monster_base *)0x0) {
    slay_local._7_1_ = false;
  }
  else {
    _Var1 = flag_has_dbg(mon->race->flags,0xc,slay->race_flag,"mon->race->flags","slay->race_flag");
    if (_Var1) {
      slay_local._7_1_ = true;
    }
    else {
      if ((slay->base != (char *)0x0) &&
         (iVar2 = strcmp(slay->base,mon->race->base->name), iVar2 == 0)) {
        return true;
      }
      slay_local._7_1_ = false;
    }
  }
  return slay_local._7_1_;
}

Assistant:

static bool react_to_specific_slay(struct slay *slay, const struct monster *mon)
{
	if (!slay->name) return false;
	if (!mon->race->base) return false;

	/* Check the race flag */
	if (rf_has(mon->race->flags, slay->race_flag))
		return true;

	/* Check for monster base */
	if (slay->base && streq(slay->base, mon->race->base->name))
		return true;

	return false;
}